

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O0

FString __thiscall PNamedType::QualifiedName(PNamedType *this)

{
  FString *this_00;
  long in_RSI;
  FString local_28;
  undefined1 local_19;
  PNamedType *this_local;
  FString *out;
  
  local_19 = 0;
  this_local = this;
  FString::FString((FString *)this);
  if (*(long *)(in_RSI + 0x98) != 0) {
    (**(code **)(**(long **)(in_RSI + 0x98) + 0x38))(&local_28);
    FString::operator=((FString *)this,&local_28);
    FString::~FString(&local_28);
  }
  this_00 = FString::operator<<((FString *)this,"::");
  FString::operator<<(this_00,(FName *)(in_RSI + 0xa0));
  return (FString)(char *)this;
}

Assistant:

FString PNamedType::QualifiedName() const
{
	FString out;
	if (Outer != nullptr) out = Outer->QualifiedName();
	out << "::" << TypeName;
	return out;
}